

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void * __thiscall Js::FunctionProxy::GetAuxPtrWithLock(FunctionProxy *this,AuxPointerType e)

{
  AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *pAVar1;
  bool bVar2;
  AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *pAVar3;
  long lVar4;
  CriticalSection *this_00;
  long lVar5;
  void *pvVar6;
  
  if ((this->auxPtrs).ptr == (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)0x0) {
    return (void *)0x0;
  }
  this_00 = &this->m_scriptContext->threadContext->csFunctionBody;
  CCLock::Enter(&this_00->super_CCLock);
  pAVar1 = (this->auxPtrs).ptr;
  if (pAVar1->count == '\x03') {
    lVar4 = 1;
    pvVar6 = (void *)0x0;
    pAVar3 = pAVar1;
    do {
      pAVar3 = (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)
               (pAVar3->offsets + 6);
      if (pAVar1->offsets[lVar4 + -2] == e) goto LAB_0076408f;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
  }
  else {
    if (pAVar1->count == '\x01') {
      bVar2 = true;
      pvVar6 = (void *)0x0;
      lVar4 = 0;
      do {
        lVar5 = lVar4;
        if (!bVar2) goto LAB_00764092;
        bVar2 = false;
        lVar4 = 1;
      } while (pAVar1->offsets[lVar5 + -1] != e);
      pAVar3 = (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)
               (pAVar1->ptrs + lVar5 + -3);
    }
    else {
      if ((ulong)pAVar1->offsets[e] == 0xff) {
        pvVar6 = (void *)0x0;
        goto LAB_00764092;
      }
      pAVar3 = (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)
               (pAVar1->ptrs + pAVar1->offsets[e]);
    }
LAB_0076408f:
    pvVar6 = *(void **)pAVar3;
  }
LAB_00764092:
  CCLock::Leave(&this_00->super_CCLock);
  return pvVar6;
}

Assistant:

void* FunctionProxy::GetAuxPtrWithLock(AuxPointerType e) const
    {
        if (this->auxPtrs == nullptr)
        {
            return nullptr;
        }

#if DBG && ENABLE_NATIVE_CODEGEN && defined(_WIN32)
        // the lock for work item queue should not be locked while accessing AuxPtrs in background thread
        auto jobProcessor = this->GetScriptContext()->GetThreadContext()->GetJobProcessor();
        auto jobProcessorCS = jobProcessor->GetCriticalSection();

        // ->IsLocked is not supported on xplat
        Assert(!jobProcessorCS || !jobProcessor->ProcessesInBackground() || !jobProcessorCS->IsLocked());
#endif

        AutoCriticalSection autoCS(this->GetScriptContext()->GetThreadContext()->GetFunctionBodyLock());
        return AuxPtrsT::GetAuxPtr(this, e);
    }